

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.H
# Opt level: O0

void __thiscall amrex::FabArrayBase::CacheStats::print(CacheStats *this)

{
  Print *this_00;
  Print *this_01;
  Print *x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  Print *in_stack_fffffffffffffdd0;
  ostream *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  int rank_;
  Print *in_stack_fffffffffffffe00;
  
  rank_ = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  OutStream();
  Print::Print(in_stack_fffffffffffffe00,rank_,in_stack_fffffffffffffdf0);
  Print::operator<<(in_stack_fffffffffffffdd0,(char (*) [5])in_stack_fffffffffffffdc8);
  this_00 = Print::operator<<(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  Print::operator<<(in_stack_fffffffffffffdd0,(char (*) [6])in_stack_fffffffffffffdc8);
  Print::operator<<(in_stack_fffffffffffffdd0,(char (*) [24])in_stack_fffffffffffffdc8);
  Print::operator<<(in_stack_fffffffffffffdd0,(long *)in_stack_fffffffffffffdc8);
  Print::operator<<(in_stack_fffffffffffffdd0,(char (*) [2])in_stack_fffffffffffffdc8);
  Print::operator<<(in_stack_fffffffffffffdd0,(char (*) [24])in_stack_fffffffffffffdc8);
  Print::operator<<(in_stack_fffffffffffffdd0,(long *)in_stack_fffffffffffffdc8);
  Print::operator<<(in_stack_fffffffffffffdd0,(char (*) [2])in_stack_fffffffffffffdc8);
  Print::operator<<(in_stack_fffffffffffffdd0,(char (*) [24])in_stack_fffffffffffffdc8);
  Print::operator<<(in_stack_fffffffffffffdd0,(long *)in_stack_fffffffffffffdc8);
  Print::operator<<(in_stack_fffffffffffffdd0,(char (*) [2])in_stack_fffffffffffffdc8);
  Print::operator<<(in_stack_fffffffffffffdd0,(char (*) [24])in_stack_fffffffffffffdc8);
  Print::operator<<(in_stack_fffffffffffffdd0,(int *)in_stack_fffffffffffffdc8);
  Print::operator<<(in_stack_fffffffffffffdd0,(char (*) [2])in_stack_fffffffffffffdc8);
  this_01 = Print::operator<<(in_stack_fffffffffffffdd0,(char (*) [24])in_stack_fffffffffffffdc8);
  x = Print::operator<<(this_01,(long *)in_stack_fffffffffffffdc8);
  Print::operator<<(this_01,(char (*) [2])x);
  Print::~Print(this_00);
  return;
}

Assistant:

void print () {
            amrex::Print(Print::AllProcs) << "### " << name << " ###\n"
                                          << "    tot # of builds  : " << nbuild  << "\n"
                                          << "    tot # of erasures: " << nerase  << "\n"
                                          << "    tot # of uses    : " << nuse    << "\n"
                                          << "    max cache size   : " << maxsize << "\n"
                                          << "    max # of uses    : " << maxuse  << "\n";
        }